

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O3

void __thiscall Diff_UncomittedTransaction_Test::TestBody(Diff_UncomittedTransaction_Test *this)

{
  undefined1 *puVar1;
  database *db;
  uint uVar2;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matchers_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  *matchers;
  pointer *__ptr;
  __normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
  _Var3;
  char *pcVar4;
  __normal_iterator<pstore::address_*,_std::vector<pstore::address,_std::allocator<pstore::address>_>_>
  in_R9;
  extent<char> eVar5;
  vector<pstore::address,_std::allocator<pstore::address>_> actual;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  transaction_type t1;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  actual_values;
  string k2;
  transaction_type t2;
  value_type v1;
  AssertHelper local_2a8;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phStack_2a0;
  long local_298;
  char local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  undefined1 local_268 [8];
  database *pdStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [2];
  undefined1 local_200 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  extent<char> local_1e0;
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [2];
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  local_188;
  string local_158;
  undefined1 local_138 [56];
  mutex_type *local_100;
  database *local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  address local_d0;
  uint64_t uStack_c8;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_c0;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
  local_90;
  
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = 0;
  local_d0.a_ = 0;
  uStack_c8 = 0;
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"key1","");
  puVar1 = &(this->super_Diff).field_0x150;
  local_1f8[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_200 = (undefined1  [8])puVar1;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_200);
  local_f8 = &(this->super_Diff).db_;
  local_1f8[0] = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_268,local_f8,(lock_type *)local_200
            );
  local_188.first._M_dataplus._M_p = (pointer)&local_188.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"first value","");
  local_100 = (mutex_type *)puVar1;
  eVar5 = anon_unknown.dwarf_1214cb::Diff::add
                    (&this->super_Diff,(transaction_type *)local_268,(string *)local_138,
                     &local_188.first);
  local_200 = (undefined1  [8])&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,local_138._0_8_,
             (pointer)(local_138._0_8_ + (long)(_func_int ***)local_138._8_8_));
  local_1e0 = eVar5;
  std::__cxx11::string::operator=((string *)&local_f0,(string *)local_200);
  local_d0 = local_1e0.addr.a_.a_;
  uStack_c8 = local_1e0.size;
  if (local_200 != (undefined1  [8])&local_1f0) {
    operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.first._M_dataplus._M_p != &local_188.first.field_2) {
    operator_delete(local_188.first._M_dataplus._M_p,
                    local_188.first.field_2._M_allocated_capacity + 1);
  }
  pstore::transaction_base::commit((transaction_base *)local_268);
  local_268 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_268);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"key2","");
  local_268 = (undefined1  [8])local_100;
  pdStack_260 = (database *)((ulong)pdStack_260 & 0xffffffffffffff00);
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_268);
  db = local_f8;
  pdStack_260 = (database *)CONCAT71(pdStack_260._1_7_,1);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_138,local_f8,(lock_type *)local_268
            );
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"second value","");
  eVar5 = anon_unknown.dwarf_1214cb::Diff::add
                    (&this->super_Diff,(transaction_type *)local_138,&local_158,(string *)local_268)
  ;
  local_188.first._M_dataplus._M_p = (pointer)&local_188.first.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_158._M_dataplus._M_p,
             local_158._M_dataplus._M_p + local_158._M_string_length);
  local_188.second = eVar5;
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
  }
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&local_278,db,true);
  _Var3._M_current = (address *)local_200;
  local_200 = (undefined1  [8])0x0;
  testing::internal::
  CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
            ((internal *)local_268,"index","nullptr",&local_278,(void **)_Var3._M_current);
  if (local_268[0] == (string)0x0) {
    testing::Message::Message((Message *)local_200);
    if (pdStack_260 == (database *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&pdStack_260->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
               ,0xa5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_200);
  }
  else {
    if (pdStack_260 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pdStack_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdStack_260)
      ;
    }
    local_2a8.data_ = (AssertHelperData *)0x0;
    phStack_2a0 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
    local_298 = 0;
    pstore::
    diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
              (db,local_278.
                  super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,0,(vector<pstore::address,_std::allocator<pstore::address>_> *)&local_2a8)
    ;
    matchers_1 = phStack_2a0;
    (anonymous_namespace)::
    addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
              (&local_1a0,(_anonymous_namespace_ *)db,(database *)local_2a8.data_,phStack_2a0,_Var3,
               in_R9);
    testing::
    UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>
              ((UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                *)&local_90,(testing *)&local_f0,&local_188,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                *)matchers_1);
    std::
    _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
    ::_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   *)local_268,&local_90);
    std::
    _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
    ::_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   *)local_200,
                  (_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_p != local_228) {
      operator_delete(local_238._M_p,local_228[0]._M_allocated_capacity + 1);
    }
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>,std::pair<std::__cxx11::string,pstore::extent<char>>>>>
    ::operator()(local_288,local_200,
                 (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                  *)"actual_values");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0[0]._M_allocated_capacity + 1);
    }
    if (local_200 != (undefined1  [8])&local_1f0) {
      operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.
           super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
           ._M_head_impl.first._M_dataplus._M_p !=
        &local_90.
         super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
         ._M_head_impl.first.field_2) {
      operator_delete(local_90.
                      super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                      ._M_head_impl.first._M_dataplus._M_p,
                      local_90.
                      super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                      ._M_head_impl.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.
           super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
           .
           super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
           ._M_head_impl.first._M_dataplus._M_p !=
        &local_90.
         super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
         .
         super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
         ._M_head_impl.first.field_2) {
      operator_delete(local_90.
                      super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                      .
                      super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                      ._M_head_impl.first._M_dataplus._M_p,
                      local_90.
                      super__Tuple_impl<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                      .
                      super__Head_base<1UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                      ._M_head_impl.first.field_2._M_allocated_capacity + 1);
    }
    if (local_288[0] == '\0') {
      testing::Message::Message((Message *)local_268);
      if (local_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_280->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                 ,0xab,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_200,(Message *)local_268);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_200);
      if (local_268 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_268 + 8))();
      }
    }
    if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_280,local_280);
    }
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
    ::~vector(&local_1a0);
    if ((database *)local_2a8.data_ != (database *)0x0) {
      operator_delete(local_2a8.data_,local_298 - (long)local_2a8.data_);
    }
    if (local_278.
        super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_278.
                 super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
              ((index *)&local_278,db,true);
    _Var3._M_current = (address *)local_200;
    local_200 = (undefined1  [8])0x0;
    testing::internal::
    CmpHelperNE<std::shared_ptr<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,decltype(nullptr)>
              ((internal *)local_268,"index","nullptr",&local_278,(void **)_Var3._M_current);
    if (local_268[0] != (string)0x0) {
      if (pdStack_260 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pdStack_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pdStack_260);
      }
      local_2a8.data_ = (AssertHelperData *)0x0;
      phStack_2a0 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0;
      local_298 = 0;
      pstore::
      diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                (db,local_278.
                    super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,1,
                 (vector<pstore::address,_std::allocator<pstore::address>_> *)&local_2a8);
      (anonymous_namespace)::
      addresses_to_values<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,__gnu_cxx::__normal_iterator<pstore::address*,std::vector<pstore::address,std::allocator<pstore::address>>>>
                (&local_1a0,(_anonymous_namespace_ *)db,(database *)local_2a8.data_,phStack_2a0,
                 _Var3,in_R9);
      testing::UnorderedElementsAre<std::pair<std::__cxx11::string,pstore::extent<char>>>
                (&local_c0,(testing *)&local_188,matchers);
      local_268 = (undefined1  [8])&local_258;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,
                 local_c0.matchers_.
                 super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                 .
                 super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                 ._M_head_impl.first._M_dataplus._M_p,
                 local_c0.matchers_.
                 super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                 .
                 super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                 ._M_head_impl.first._M_dataplus._M_p +
                 local_c0.matchers_.
                 super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                 .
                 super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                 ._M_head_impl.first._M_string_length);
      local_248 = (undefined4)
                  local_c0.matchers_.
                  super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                  .
                  super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                  ._M_head_impl.second.addr.a_.a_;
      uStack_244 = local_c0.matchers_.
                   super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   .
                   super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                   ._M_head_impl.second.addr.a_.a_._4_4_;
      uStack_240 = (undefined4)
                   local_c0.matchers_.
                   super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   .
                   super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                   ._M_head_impl.second.size;
      uStack_23c = local_c0.matchers_.
                   super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                   .
                   super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                   ._M_head_impl.second.size._4_4_;
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_200,local_268,
                 (char *)((long)local_268 + (long)&pdStack_260->_vptr_database));
      local_1e0.addr.a_.a_._4_4_ = uStack_244;
      local_1e0.addr.a_.a_._0_4_ = local_248;
      local_1e0.size._4_4_ = uStack_23c;
      local_1e0.size._0_4_ = uStack_240;
      if (local_268 != (undefined1  [8])&local_258) {
        operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,pstore::extent<char>>>>>
      ::operator()(local_288,local_200,
                   (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                    *)"actual_values");
      if (local_200 != (undefined1  [8])&local_1f0) {
        operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.matchers_.
             super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
             .
             super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
             ._M_head_impl.first._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_c0.matchers_.
                     super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                     .
                     super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                     ._M_head_impl.first + 0x10U)) {
        operator_delete(local_c0.matchers_.
                        super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        .
                        super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                        ._M_head_impl.first._M_dataplus._M_p,
                        local_c0.matchers_.
                        super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        .
                        super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_false>
                        ._M_head_impl.first.field_2._M_allocated_capacity + 1);
      }
      if (local_288[0] == '\0') {
        testing::Message::Message((Message *)local_268);
        if (local_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_280->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0xb7,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_200,(Message *)local_268);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_200);
        if (local_268 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_268 + 8))();
        }
      }
      if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_280,local_280);
      }
      std::
      vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ::~vector(&local_1a0);
      if ((database *)local_2a8.data_ != (database *)0x0) {
        operator_delete(local_2a8.data_,local_298 - (long)local_2a8.data_);
      }
      if (local_278.
          super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_278.
                   super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar2 = pstore::database::get_current_revision(db);
      local_200._0_4_ = uVar2;
      local_2a8.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_268,"db_.get_current_revision ()","1U",(uint *)local_200,
                 (uint *)&local_2a8);
      if (local_268[0] == (string)0x0) {
        testing::Message::Message((Message *)local_200);
        if (pdStack_260 == (database *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((_Alloc_hider *)&pdStack_260->_vptr_database)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0xbc,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_2a8);
        if (local_200 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_200 + 8))();
        }
      }
      if (pdStack_260 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pdStack_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pdStack_260);
      }
      local_268 = (undefined1  [8])0x0;
      pdStack_260 = (database *)0x0;
      local_258._M_allocated_capacity = 0;
      pstore::index::
      get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                ((index *)local_200,db,true);
      pstore::
      diff<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                (db,(hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_200,2,
                 (vector<pstore::address,_std::allocator<pstore::address>_> *)local_268);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1f8._1_7_,local_1f8[0]) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(local_1f8._1_7_,local_1f8[0]));
      }
      local_2a8.data_ = (AssertHelperData *)((long)pdStack_260 - (long)local_268 >> 3);
      local_1a0.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_200,"actual.size ()","0U",(unsigned_long *)&local_2a8,
                 (uint *)&local_1a0);
      if (local_200[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_2a8);
        if ((undefined8 *)CONCAT71(local_1f8._1_7_,local_1f8[0]) == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)CONCAT71(local_1f8._1_7_,local_1f8[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
                   ,0xc0,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_2a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
        if ((database *)local_2a8.data_ != (database *)0x0) {
          (**(code **)(*(long *)local_2a8.data_ + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(local_1f8._1_7_,local_1f8[0]) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(local_1f8._1_7_,local_1f8[0]));
      }
      if (local_268 != (undefined1  [8])0x0) {
        operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
      }
      pstore::transaction_base::commit((transaction_base *)local_138);
      goto LAB_0015c82a;
    }
    testing::Message::Message((Message *)local_200);
    if (pdStack_260 == (database *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&pdStack_260->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_diff.cpp"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_200);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_2a8);
  if (local_200 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_200 + 8))();
  }
  if (pdStack_260 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pdStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdStack_260);
  }
  if (local_278.
      super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.
               super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
LAB_0015c82a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.first._M_dataplus._M_p != &local_188.first.field_2) {
    operator_delete(local_188.first._M_dataplus._M_p,
                    local_188.first.field_2._M_allocated_capacity + 1);
  }
  local_138._0_8_ = &PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return;
}

Assistant:

TEST_F (Diff, UncomittedTransaction) {
    using ::testing::UnorderedElementsAre;

    using value_type = std::pair<std::string, pstore::extent<char>>;
    value_type v1;

    {
        std::string const k1 = "key1";
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        v1 = std::make_pair (k1, this->add (t1, k1, "first value"));
        t1.commit ();
    }

    // The transaction t2 is left uncommitted whilst we perform the diff.
    std::string const k2 = "key2";
    transaction_type t2 = begin (db_, lock_guard{mutex_});
    value_type v2 = std::make_pair (k2, this->add (t2, k2, "second value"));

    {
        // Check the diff between now (the uncommitted r2) and r0.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 0U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, UnorderedElementsAre (v1, v2));
    }

    {
        // Check the diff between now and r1.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 1U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, UnorderedElementsAre (v2));
    }

    {
        // Note that get_current_revision() still reports 1 even though a transaction is open.
        EXPECT_EQ (db_.get_current_revision (), 1U);
        std::vector<pstore::address> actual;
        pstore::diff (db_, *pstore::index::get_index<pstore::trailer::indices::write> (db_), 2U,
                      std::back_inserter (actual));
        EXPECT_EQ (actual.size (), 0U);
    }

    t2.commit ();
}